

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O3

void testing::anon_unknown_32::PrintByteSegmentInObjectTo
               (uchar *obj_bytes,size_t start,size_t count,ostream *os)

{
  char *__s;
  size_t sVar1;
  char *pcVar2;
  long lVar3;
  bool bVar4;
  char text [5];
  char local_3a [10];
  
  local_3a[6] = 0;
  local_3a[2] = '\0';
  local_3a[3] = '\0';
  local_3a[4] = '\0';
  local_3a[5] = '\0';
  if (count != 0) {
    __s = local_3a + 2;
    lVar3 = 0;
    do {
      bVar4 = lVar3 != 0;
      lVar3 = lVar3 + -1;
      if (bVar4) {
        if ((start & 1) == 0) {
          local_3a[0] = ' ';
          pcVar2 = local_3a;
        }
        else {
          local_3a[1] = 0x2d;
          pcVar2 = local_3a + 1;
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,pcVar2,1);
      }
      snprintf(__s,5,"%02X",(ulong)obj_bytes[start]);
      sVar1 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar1);
      start = start + 1;
    } while (-lVar3 != count);
  }
  return;
}

Assistant:

void PrintByteSegmentInObjectTo(const unsigned char* obj_bytes, size_t start,
                                size_t count, ostream* os) {
  char text[5] = "";
  for (size_t i = 0; i != count; i++) {
    const size_t j = start + i;
    if (i != 0) {
      // Organizes the bytes into groups of 2 for easy parsing by
      // human.
      if ((j % 2) == 0)
        *os << ' ';
      else
        *os << '-';
    }
    GTEST_SNPRINTF_(text, sizeof(text), "%02X", obj_bytes[j]);
    *os << text;
  }
}